

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_kpr_mri.c
# Opt level: O0

int Jn(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2,
      N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long *plVar4;
  double *in_RCX;
  char *pcVar5;
  int in_EDX;
  int extraout_EDX;
  undefined4 in_register_00000014;
  void *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar6;
  double extraout_XMM0_Qa;
  double t_00;
  sunrealtype sVar7;
  double extraout_XMM0_Qa_00;
  sunrealtype v;
  sunrealtype u;
  sunrealtype e;
  sunrealtype G;
  sunrealtype *rpar;
  void *user_data_00;
  
  plVar4 = (long *)CONCAT44(in_register_00000014,in_EDX);
  user_data_00 = (void *)*in_RCX;
  dVar1 = in_RCX[2];
  dVar2 = **(double **)(*in_RDI + 0x10);
  dVar3 = *(double *)(*(long *)(*in_RDI + 0x10) + 8);
  dVar6 = (double)user_data_00 / 2.0;
  r(in_RCX,in_RSI,in_EDX,(char *)in_RCX,in_R8D,in_R9D);
  t_00 = extraout_XMM0_Qa + 1.0;
  sVar7 = rdot(t_00,user_data_00);
  pcVar5 = (char *)0x8000000000000000;
  *(double *)**(undefined8 **)(*plVar4 + 0x20) =
       dVar6 + ((double)user_data_00 * t_00 + -sVar7) / (dVar2 * 2.0 * dVar2);
  sVar7 = s(t_00,user_data_00);
  **(double **)(*(long *)(*plVar4 + 0x20) + 8) =
       dVar1 / 2.0 + (dVar1 * (sVar7 + 2.0)) / (dVar3 * 2.0 * dVar3);
  r(in_RCX,in_RSI,extraout_EDX,pcVar5,in_R8D,in_R9D);
  *(double *)(**(long **)(*plVar4 + 0x20) + 8) =
       dVar1 / 2.0 + (dVar1 * (extraout_XMM0_Qa_00 + 1.0)) / (dVar2 * 2.0 * dVar2);
  sVar7 = s(t_00,user_data_00);
  *(double *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + 8) =
       -0.5 - (sVar7 + 2.0) / (dVar3 * 2.0 * dVar3);
  return 0;
}

Assistant:

static int Jn(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
              void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype* rpar   = (sunrealtype*)user_data;
  const sunrealtype G = rpar[0];
  const sunrealtype e = rpar[2];
  const sunrealtype u = NV_Ith_S(y, 0);
  const sunrealtype v = NV_Ith_S(y, 1);

  /* fill in the Jacobian:
     [G/2 + (G*(1+r(t))-rdot(t))/(2*u^2)     e/2 + e*(2+s(t))/(2*v^2)]
     [e/2+e*(1+r(t))/(2*u^2)                -1/2 - (2+s(t))/(2*v^2)  ] */
  SM_ELEMENT_D(J, 0, 0) = G / TWO + (G * (ONE + r(t, rpar)) - rdot(t, rpar)) /
                                      (2 * u * u);
  SM_ELEMENT_D(J, 0, 1) = e / TWO + e * (TWO + s(t, rpar)) / (TWO * v * v);
  SM_ELEMENT_D(J, 1, 0) = e / TWO + e * (ONE + r(t, rpar)) / (TWO * u * u);
  SM_ELEMENT_D(J, 1, 1) = -ONE / TWO - (TWO + s(t, rpar)) / (TWO * v * v);

  /* Return with success */
  return 0;
}